

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::script_json_test::test_method(script_json_test *this)

{
  long lVar1;
  int iVar2;
  string strFlags;
  bool bVar3;
  check_type cVar11;
  UniValue *pUVar4;
  UniValue *pUVar5;
  string *psVar6;
  long lVar7;
  iterator in_R8;
  string *in_R9;
  uint uVar8;
  ulong index;
  size_t index_00;
  long lVar9;
  uint uVar10;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  string_view jsondata;
  string_view hex_str;
  const_string file;
  const_string file_00;
  int in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  check_type cVar12;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  CScriptWitness witness;
  char *local_1f8;
  char *local_1f0;
  assertion_result local_1e8;
  char *local_1d0;
  undefined **local_1c8;
  undefined1 local_1c0;
  undefined ***local_1b8;
  string *local_1b0;
  lazy_ostream local_1a8;
  undefined ***local_198;
  string *local_190;
  assertion_result local_188;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  string local_150 [32];
  CScript scriptPubKey;
  string scriptPubKeyString;
  CScript scriptSig;
  string scriptSigString;
  string strTest;
  UniValue tests;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str = json_tests::detail_script_tests_bytes;
  jsondata._M_len = 0x34a49;
  read_json(&tests,jsondata);
  uVar10 = 0;
  do {
    if ((ulong)(((long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar10) {
      UniValue::~UniValue(&tests);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    pUVar4 = UniValue::operator[](&tests,(ulong)uVar10);
    UniValue::write_abi_cxx11_((UniValue *)&strTest,(int)pUVar4,(void *)0x0,0);
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    witness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_004c6afa:
      _cVar11 = CHECK_PRED;
      index_00 = 0;
    }
    else {
      pUVar5 = UniValue::operator[](pUVar4,0);
      if (pUVar5->typ != VARR) goto LAB_004c6afa;
      uVar8 = 0;
      while( true ) {
        pUVar5 = UniValue::operator[](pUVar4,0);
        index = (ulong)uVar8;
        if (((long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x58 - 1U <= index) break;
        pUVar5 = UniValue::operator[](pUVar4,0);
        pUVar5 = UniValue::operator[](pUVar5,index);
        psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
        hex_str._M_str = (psVar6->_M_dataplus)._M_p;
        hex_str._M_len = psVar6->_M_string_length;
        ParseHex<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,hex_str);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)&witness,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8);
        uVar8 = uVar8 + 1;
      }
      pUVar5 = UniValue::operator[](pUVar4,0);
      pUVar5 = UniValue::operator[](pUVar5,index);
      _cVar11 = (check_type)AmountFromValue(pUVar5,8);
      index_00 = 1;
    }
    lVar7 = (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start;
    iVar2 = (int)index_00;
    if ((ulong)(lVar7 / 0x58) < (ulong)(iVar2 + 4)) {
      if (lVar7 != 0x58) {
        local_228 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
        ;
        local_220 = "";
        local_238 = &boost::unit_test::basic_cstring<char_const>::null;
        local_230 = &boost::unit_test::basic_cstring<char_const>::null;
        msg.m_end = (iterator)in_R9;
        msg.m_begin = in_R8;
        file.m_end = (iterator)0x3a9;
        file.m_begin = (iterator)&local_228;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_238,
                   msg);
        local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
        local_1e8.m_message.px = (element_type *)0x0;
        local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_1c0 = 0;
        local_1c8 = &PTR__lazy_ostream_01139a58;
        local_1b8 = (undefined ***)boost::unit_test::lazy_ostream::inst;
        local_1b0 = (string *)0xb580cc;
        local_1a8.m_empty = false;
        local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139a98;
        local_198 = &local_1c8;
        local_190 = &strTest;
        local_248 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
        ;
        local_240 = "";
        in_stack_fffffffffffffd98 = 0;
        in_stack_fffffffffffffd9c = 0;
        in_R8 = &DAT_00000001;
        in_R9 = (string *)&DAT_00000001;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1e8,&local_1a8,1,1,WARN,_cVar12,(size_t)&local_248,0x3a9);
        boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
      }
    }
    else {
      pUVar5 = UniValue::operator[](pUVar4,index_00);
      psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
      std::__cxx11::string::string((string *)&scriptSigString,psVar6);
      ParseScript(&scriptSig,&scriptSigString);
      pUVar5 = UniValue::operator[](pUVar4,(ulong)(iVar2 + 1));
      psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
      std::__cxx11::string::string((string *)&scriptPubKeyString,psVar6);
      ParseScript(&scriptPubKey,&scriptPubKeyString);
      pUVar5 = UniValue::operator[](pUVar4,(ulong)(iVar2 + 2));
      psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
      std::__cxx11::string::string(local_150,psVar6);
      strFlags._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffd9c;
      strFlags._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffd98;
      strFlags._M_string_length = (size_type)_cVar12;
      strFlags.field_2._M_allocated_capacity = (size_type)_cVar11;
      strFlags.field_2._8_8_ = this;
      uVar8 = ParseScriptFlags(strFlags);
      std::__cxx11::string::~string(local_150);
      pUVar4 = UniValue::operator[](pUVar4,(ulong)(iVar2 + 3));
      psVar6 = UniValue::get_str_abi_cxx11_(pUVar4);
      lVar7 = -0x10;
      do {
        lVar9 = lVar7;
        if (lVar9 == 0x2a0) {
          local_160 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_158 = "";
          local_170 = &boost::unit_test::basic_cstring<char_const>::null;
          local_168 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_00.m_end = (iterator)in_R9;
          msg_00.m_begin = in_R8;
          file_00.m_end = (iterator)0x6f;
          file_00.m_begin = (iterator)&local_160;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_170,msg_00);
          local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
          local_188.m_message.px = (element_type *)0x0;
          local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_1e8.m_message.px =
               (element_type *)((ulong)local_1e8.m_message.px & 0xffffffffffffff00);
          local_1e8._0_8_ = &PTR__lazy_ostream_0113b570;
          local_1e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_1d0 = "Unknown scripterror \"";
          local_1c0 = 0;
          local_1c8 = &PTR__lazy_ostream_0113e270;
          local_1b8 = (undefined ***)&local_1e8;
          local_1a8.m_empty = false;
          local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113e230;
          local_198 = &local_1c8;
          local_190 = (string *)0xbcf158;
          local_1f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_1f0 = "";
          in_stack_fffffffffffffd9c = 0;
          in_stack_fffffffffffffd98 = 1;
          local_1b0 = psVar6;
          boost::test_tools::tt_detail::report_assertion
                    (&local_188,&local_1a8,1,1,WARN,_cVar12,(size_t)&local_1f8,0x6f);
          boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
          _cVar12 = _cVar11;
          goto LAB_004c6ec0;
        }
        bVar3 = std::operator==(psVar6,*(char **)((long)&script_errors[1].name + lVar9));
        lVar7 = lVar9 + 0x10;
      } while (!bVar3);
      in_stack_fffffffffffffd98 = *(int *)((long)&script_errors[1].err + lVar9);
      _cVar12 = _cVar11;
LAB_004c6ec0:
      in_R8 = (iterator)(ulong)uVar8;
      in_R9 = &strTest;
      ScriptTest::DoTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&scriptPubKey,&scriptSig,&witness
                         ,uVar8,in_R9,in_stack_fffffffffffffd98,(CAmount)_cVar12);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
      std::__cxx11::string::~string((string *)&scriptPubKeyString);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
      std::__cxx11::string::~string((string *)&scriptSigString);
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&witness.stack);
    std::__cxx11::string::~string((string *)&strTest);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(script_json_test)
{
    // Read tests from test/data/script_tests.json
    // Format is an array of arrays
    // Inner arrays are [ ["wit"..., nValue]?, "scriptSig", "scriptPubKey", "flags", "expected_scripterror" ]
    // ... where scriptSig and scriptPubKey are stringified
    // scripts.
    // If a witness is given, then the last value in the array should be the
    // amount (nValue) to use in the crediting tx
    UniValue tests = read_json(json_tests::script_tests);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        CScriptWitness witness;
        CAmount nValue = 0;
        unsigned int pos = 0;
        if (test.size() > 0 && test[pos].isArray()) {
            unsigned int i=0;
            for (i = 0; i < test[pos].size()-1; i++) {
                witness.stack.push_back(ParseHex(test[pos][i].get_str()));
            }
            nValue = AmountFromValue(test[pos][i]);
            pos++;
        }
        if (test.size() < 4 + pos) // Allow size > 3; extra stuff ignored (useful for comments)
        {
            if (test.size() != 1) {
                BOOST_ERROR("Bad test: " << strTest);
            }
            continue;
        }
        std::string scriptSigString = test[pos++].get_str();
        CScript scriptSig = ParseScript(scriptSigString);
        std::string scriptPubKeyString = test[pos++].get_str();
        CScript scriptPubKey = ParseScript(scriptPubKeyString);
        unsigned int scriptflags = ParseScriptFlags(test[pos++].get_str());
        int scriptError = ParseScriptError(test[pos++].get_str());

        DoTest(scriptPubKey, scriptSig, witness, scriptflags, strTest, scriptError, nValue);
    }
}